

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UCalendarDateFields __thiscall
icu_63::Calendar::resolveFields(Calendar *this,UFieldResolutionTable *precedenceTable)

{
  int iVar1;
  UCalendarDateFields UVar2;
  UCalendarDateFields UVar3;
  int iVar4;
  int32_t *piVar5;
  int32_t g;
  long lVar6;
  int32_t (*paiVar7) [8];
  UCalendarDateFields UVar8;
  UCalendarDateFields UVar9;
  int iVar10;
  int32_t l;
  long lVar11;
  int32_t (*paiVar12) [8];
  
  UVar2 = UCAL_FIELD_COUNT;
  lVar6 = 0;
  paiVar7 = *precedenceTable;
  do {
    if ((precedenceTable[lVar6][0][0] == -1) || (UVar2 != UCAL_FIELD_COUNT)) {
      return UVar2;
    }
    iVar4 = 0;
    paiVar12 = paiVar7;
    UVar2 = UCAL_FIELD_COUNT;
    for (lVar11 = 0; UVar9 = precedenceTable[lVar6][lVar11][0], UVar9 != ~UCAL_ERA;
        lVar11 = lVar11 + 1) {
      iVar10 = 0;
      for (piVar5 = *(int32_t (*) [8])*paiVar12 + (0x1f < (int)UVar9); UVar3 = UVar2,
          (long)*piVar5 != -1; piVar5 = piVar5 + 1) {
        iVar1 = this->fStamp[*piVar5];
        if (iVar1 == 0) goto LAB_001f4e9a;
        if (iVar10 < iVar1) {
          iVar10 = iVar1;
        }
      }
      if (iVar4 < iVar10) {
        UVar3 = UVar9;
        if (0x1f < (int)UVar9) {
          UVar8 = UVar9 & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET);
          UVar9 = UCAL_DATE;
          UVar3 = UVar2;
          if (UVar8 != UCAL_DATE || this->fStamp[4] < this->fStamp[5]) {
            UVar9 = UVar8;
            UVar3 = UVar8;
          }
        }
        if (UVar3 == UVar9) {
          iVar4 = iVar10;
        }
      }
LAB_001f4e9a:
      paiVar12 = paiVar12 + 1;
      UVar2 = UVar3;
    }
    lVar6 = lVar6 + 1;
    paiVar7 = paiVar7 + 0xc;
  } while( true );
}

Assistant:

UCalendarDateFields Calendar::resolveFields(const UFieldResolutionTable* precedenceTable) {
    int32_t bestField = UCAL_FIELD_COUNT;
    int32_t tempBestField;
    for (int32_t g=0; precedenceTable[g][0][0] != -1 && (bestField == UCAL_FIELD_COUNT); ++g) {
        int32_t bestStamp = kUnset;
        for (int32_t l=0; precedenceTable[g][l][0] != -1; ++l) {
            int32_t lineStamp = kUnset;
            // Skip over first entry if it is negative
            for (int32_t i=((precedenceTable[g][l][0]>=kResolveRemap)?1:0); precedenceTable[g][l][i]!=-1; ++i) {
                U_ASSERT(precedenceTable[g][l][i] < UCAL_FIELD_COUNT);
                int32_t s = fStamp[precedenceTable[g][l][i]];
                // If any field is unset then don't use this line
                if (s == kUnset) {
                    goto linesInGroup;
                } else if(s > lineStamp) {
                    lineStamp = s;
                }
            }
            // Record new maximum stamp & field no.
            if (lineStamp > bestStamp) {
                tempBestField = precedenceTable[g][l][0]; // First field refers to entire line
                if (tempBestField >= kResolveRemap) {
                    tempBestField &= (kResolveRemap-1);
                    // This check is needed to resolve some issues with UCAL_YEAR precedence mapping
                    if (tempBestField != UCAL_DATE || (fStamp[UCAL_WEEK_OF_MONTH] < fStamp[tempBestField])) {
                        bestField = tempBestField;
                    }
                } else {
                    bestField = tempBestField;
                }

                if (bestField == tempBestField) {
                    bestStamp = lineStamp;
                }
            }
linesInGroup:
            ;
        }
    }
    return (UCalendarDateFields)bestField;
}